

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O2

void aom_smooth_h_predictor_64x16_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  ulong uVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  int y_mask;
  uint uVar22;
  uint8_t *puVar23;
  short sVar24;
  short sVar25;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  undefined1 auVar26 [16];
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  short sVar59;
  short sVar60;
  short sVar61;
  short sVar62;
  short sVar63;
  short sVar64;
  short sVar65;
  short sVar66;
  short sVar67;
  short sVar68;
  short sVar69;
  short sVar70;
  short sVar71;
  short sVar72;
  short sVar73;
  short sVar74;
  short sVar75;
  short sVar76;
  short sVar77;
  short sVar78;
  short sVar79;
  short sVar80;
  short sVar81;
  short sVar82;
  short sVar83;
  short sVar84;
  short sVar85;
  short sVar86;
  short sVar87;
  short sVar88;
  undefined1 auVar89 [16];
  ushort uVar90;
  ushort uVar91;
  ushort uVar92;
  ushort uVar93;
  ushort uVar94;
  ushort uVar95;
  ushort uVar96;
  ushort uVar97;
  ushort uVar98;
  ushort uVar99;
  ushort uVar100;
  ushort uVar101;
  ushort uVar102;
  ushort uVar103;
  ushort uVar104;
  ushort uVar105;
  short sVar106;
  ushort uVar107;
  ushort uVar108;
  short sVar111;
  short sVar114;
  short sVar117;
  short sVar120;
  short sVar123;
  short sVar126;
  undefined1 auVar109 [16];
  ushort uVar112;
  ushort uVar113;
  ushort uVar115;
  ushort uVar116;
  ushort uVar118;
  ushort uVar119;
  ushort uVar121;
  ushort uVar122;
  ushort uVar124;
  ushort uVar125;
  ushort uVar127;
  ushort uVar128;
  short sVar129;
  ushort uVar130;
  ushort uVar131;
  undefined1 auVar110 [16];
  
  auVar26 = pshuflw(ZEXT116(top_row[0x3f]),ZEXT116(top_row[0x3f]),0);
  uVar1 = *(ulong *)left_column;
  sVar24 = auVar26._0_2_;
  sVar33 = auVar26._2_2_;
  auVar2._8_6_ = 0;
  auVar2._0_8_ = uVar1;
  auVar2[0xe] = (char)(uVar1 >> 0x38);
  auVar4._8_4_ = 0;
  auVar4._0_8_ = uVar1;
  auVar4[0xc] = (char)(uVar1 >> 0x30);
  auVar4._13_2_ = auVar2._13_2_;
  auVar6._8_4_ = 0;
  auVar6._0_8_ = uVar1;
  auVar6._12_3_ = auVar4._12_3_;
  auVar8._8_2_ = 0;
  auVar8._0_8_ = uVar1;
  auVar8[10] = (char)(uVar1 >> 0x28);
  auVar8._11_4_ = auVar6._11_4_;
  auVar10._8_2_ = 0;
  auVar10._0_8_ = uVar1;
  auVar10._10_5_ = auVar8._10_5_;
  auVar12[8] = (char)(uVar1 >> 0x20);
  auVar12._0_8_ = uVar1;
  auVar12._9_6_ = auVar10._9_6_;
  auVar16._7_8_ = 0;
  auVar16._0_7_ = auVar12._8_7_;
  auVar18._1_8_ = SUB158(auVar16 << 0x40,7);
  auVar18[0] = (char)(uVar1 >> 0x18);
  auVar18._9_6_ = 0;
  auVar19._1_10_ = SUB1510(auVar18 << 0x30,5);
  auVar19[0] = (char)(uVar1 >> 0x10);
  auVar19._11_4_ = 0;
  auVar14[2] = (char)(uVar1 >> 8);
  auVar14._0_2_ = (ushort)uVar1;
  auVar14._3_12_ = SUB1512(auVar19 << 0x20,3);
  auVar26._0_2_ = (ushort)uVar1 & 0xff;
  auVar26._2_13_ = auVar14._2_13_;
  auVar26[0xf] = 0;
  sVar34 = sVar33 * 8 + 0x80;
  sVar35 = sVar24 * 0x10 + 0x80;
  sVar36 = sVar33 * 0x17 + 0x80;
  sVar37 = sVar24 * 0x1f + 0x80;
  sVar38 = sVar33 * 0x26 + 0x80;
  sVar39 = sVar24 * 0x2e + 0x80;
  sVar40 = sVar33 * 0x35 + 0x80;
  sVar41 = sVar24 * 0x3c + 0x80;
  sVar42 = sVar33 * 0x43 + 0x80;
  sVar43 = sVar24 * 0x4a + 0x80;
  sVar44 = sVar33 * 0x50 + 0x80;
  sVar45 = sVar24 * 0x57 + 0x80;
  sVar46 = sVar33 * 0x5d + 0x80;
  sVar47 = sVar24 * 100 + 0x80;
  sVar48 = sVar33 * 0x6a + 0x80;
  sVar49 = sVar24 * 0x70 + 0x80;
  sVar50 = sVar33 * 0x76 + 0x80;
  sVar51 = sVar24 * 0x7b + 0x80;
  sVar52 = sVar33 * 0x81 + 0x80;
  sVar53 = sVar24 * 0x87 + 0x80;
  sVar54 = sVar33 * 0x8c + 0x80;
  sVar55 = sVar24 * 0x91 + 0x80;
  sVar56 = sVar33 * 0x96 + 0x80;
  sVar57 = sVar24 * 0x9b + 0x80;
  sVar58 = sVar33 * 0xa0 + 0x80;
  sVar59 = sVar24 * 0xa5 + 0x80;
  sVar60 = sVar33 * 0xaa + 0x80;
  sVar61 = sVar24 * 0xae + 0x80;
  sVar62 = sVar33 * 0xb3 + 0x80;
  sVar63 = sVar24 * 0xb7 + 0x80;
  sVar64 = sVar33 * 0xbb + 0x80;
  sVar65 = sVar24 * 0xbf + 0x80;
  sVar66 = sVar33 * 0xc3 + 0x80;
  sVar67 = sVar24 * 199 + 0x80;
  sVar68 = sVar33 * 0xca + 0x80;
  sVar69 = sVar24 * 0xce + 0x80;
  sVar70 = sVar33 * 0xd1 + 0x80;
  sVar71 = sVar24 * 0xd4 + 0x80;
  sVar72 = sVar33 * 0xd7 + 0x80;
  sVar73 = sVar24 * 0xda + 0x80;
  sVar74 = sVar33 * 0xdd + 0x80;
  sVar75 = sVar24 * 0xe0 + 0x80;
  sVar76 = sVar33 * 0xe3 + 0x80;
  sVar77 = sVar24 * 0xe5 + 0x80;
  sVar78 = sVar33 * 0xe7 + 0x80;
  sVar79 = sVar24 * 0xea + 0x80;
  sVar80 = sVar33 * 0xec + 0x80;
  sVar81 = sVar24 * 0xee + 0x80;
  sVar82 = sVar33 * 0xf0 + 0x80;
  sVar83 = sVar24 * 0xf1 + 0x80;
  sVar84 = sVar33 * 0xf3 + 0x80;
  sVar85 = sVar24 * 0xf4 + 0x80;
  sVar86 = sVar33 * 0xf6 + 0x80;
  sVar87 = sVar24 * 0xf7 + 0x80;
  sVar88 = sVar33 * 0xf8 + 0x80;
  sVar25 = sVar24 * 0xf9 + 0x80;
  sVar27 = sVar33 * 0xfa + 0x80;
  sVar28 = sVar24 * 0xfa + 0x80;
  sVar29 = sVar33 * 0xfb + 0x80;
  sVar30 = sVar24 * 0xfb + 0x80;
  sVar31 = sVar33 * 0xfc + 0x80;
  sVar32 = sVar24 * 0xfc + 0x80;
  sVar33 = sVar33 * 0xfc + 0x80;
  puVar23 = dst + 0x30;
  for (uVar22 = 0x1000100; uVar22 < 0xf0e0f0f; uVar22 = uVar22 + 0x2020202) {
    auVar109._4_4_ = uVar22;
    auVar109._0_4_ = uVar22;
    auVar109._8_4_ = uVar22;
    auVar109._12_4_ = uVar22;
    auVar89 = pshufb(auVar26,auVar109);
    sVar106 = auVar89._0_2_;
    sVar111 = auVar89._2_2_;
    sVar114 = auVar89._4_2_;
    sVar117 = auVar89._6_2_;
    sVar120 = auVar89._8_2_;
    sVar123 = auVar89._10_2_;
    sVar126 = auVar89._12_2_;
    sVar129 = auVar89._14_2_;
    uVar107 = sVar106 * 0xff + sVar24 + 0x80;
    uVar112 = sVar111 * 0xf8 + sVar34;
    uVar115 = sVar114 * 0xf0 + sVar35;
    uVar118 = sVar117 * 0xe9 + sVar36;
    uVar121 = sVar120 * 0xe1 + sVar37;
    uVar124 = sVar123 * 0xda + sVar38;
    uVar127 = sVar126 * 0xd2 + sVar39;
    uVar130 = sVar129 * 0xcb + sVar40;
    uVar108 = uVar107 >> 8;
    uVar113 = uVar112 >> 8;
    uVar116 = uVar115 >> 8;
    uVar119 = uVar118 >> 8;
    uVar122 = uVar121 >> 8;
    uVar125 = uVar124 >> 8;
    uVar128 = uVar127 >> 8;
    uVar131 = uVar130 >> 8;
    uVar90 = sVar106 * 0xc4 + sVar41;
    uVar92 = sVar111 * 0xbd + sVar42;
    uVar94 = sVar114 * 0xb6 + sVar43;
    uVar96 = sVar117 * 0xb0 + sVar44;
    uVar98 = sVar120 * 0xa9 + sVar45;
    uVar100 = sVar123 * 0xa3 + sVar46;
    uVar102 = sVar126 * 0x9c + sVar47;
    uVar104 = sVar129 * 0x96 + sVar48;
    uVar91 = uVar90 >> 8;
    uVar93 = uVar92 >> 8;
    uVar95 = uVar94 >> 8;
    uVar97 = uVar96 >> 8;
    uVar99 = uVar98 >> 8;
    uVar101 = uVar100 >> 8;
    uVar103 = uVar102 >> 8;
    uVar105 = uVar104 >> 8;
    puVar23[-0x30] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar107 >> 8) - (0xff < uVar108);
    puVar23[-0x2f] = (uVar113 != 0) * (uVar113 < 0x100) * (char)(uVar112 >> 8) - (0xff < uVar113);
    puVar23[-0x2e] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar23[-0x2d] = (uVar119 != 0) * (uVar119 < 0x100) * (char)(uVar118 >> 8) - (0xff < uVar119);
    puVar23[-0x2c] = (uVar122 != 0) * (uVar122 < 0x100) * (char)(uVar121 >> 8) - (0xff < uVar122);
    puVar23[-0x2b] = (uVar125 != 0) * (uVar125 < 0x100) * (char)(uVar124 >> 8) - (0xff < uVar125);
    puVar23[-0x2a] = (uVar128 != 0) * (uVar128 < 0x100) * (char)(uVar127 >> 8) - (0xff < uVar128);
    puVar23[-0x29] = (uVar131 != 0) * (uVar131 < 0x100) * (char)(uVar130 >> 8) - (0xff < uVar131);
    puVar23[-0x28] = (uVar91 != 0) * (uVar91 < 0x100) * (char)(uVar90 >> 8) - (0xff < uVar91);
    puVar23[-0x27] = (uVar93 != 0) * (uVar93 < 0x100) * (char)(uVar92 >> 8) - (0xff < uVar93);
    puVar23[-0x26] = (uVar95 != 0) * (uVar95 < 0x100) * (char)(uVar94 >> 8) - (0xff < uVar95);
    puVar23[-0x25] = (uVar97 != 0) * (uVar97 < 0x100) * (char)(uVar96 >> 8) - (0xff < uVar97);
    puVar23[-0x24] = (uVar99 != 0) * (uVar99 < 0x100) * (char)(uVar98 >> 8) - (0xff < uVar99);
    puVar23[-0x23] = (uVar101 != 0) * (uVar101 < 0x100) * (char)(uVar100 >> 8) - (0xff < uVar101);
    puVar23[-0x22] = (uVar103 != 0) * (uVar103 < 0x100) * (char)(uVar102 >> 8) - (0xff < uVar103);
    puVar23[-0x21] = (uVar105 != 0) * (uVar105 < 0x100) * (char)(uVar104 >> 8) - (0xff < uVar105);
    uVar90 = sVar106 * 0x90 + sVar49;
    uVar92 = sVar111 * 0x8a + sVar50;
    uVar94 = sVar114 * 0x85 + sVar51;
    uVar96 = sVar117 * 0x7f + sVar52;
    uVar98 = sVar120 * 0x79 + sVar53;
    uVar100 = sVar123 * 0x74 + sVar54;
    uVar102 = sVar126 * 0x6f + sVar55;
    uVar104 = sVar129 * 0x6a + sVar56;
    uVar91 = uVar90 >> 8;
    uVar93 = uVar92 >> 8;
    uVar95 = uVar94 >> 8;
    uVar97 = uVar96 >> 8;
    uVar99 = uVar98 >> 8;
    uVar101 = uVar100 >> 8;
    uVar103 = uVar102 >> 8;
    uVar105 = uVar104 >> 8;
    uVar107 = sVar106 * 0x65 + sVar57;
    uVar112 = sVar111 * 0x60 + sVar58;
    uVar115 = sVar114 * 0x5b + sVar59;
    uVar118 = sVar117 * 0x56 + sVar60;
    uVar121 = sVar120 * 0x52 + sVar61;
    uVar124 = sVar123 * 0x4d + sVar62;
    uVar127 = sVar126 * 0x49 + sVar63;
    uVar130 = sVar129 * 0x45 + sVar64;
    uVar108 = uVar107 >> 8;
    uVar113 = uVar112 >> 8;
    uVar116 = uVar115 >> 8;
    uVar119 = uVar118 >> 8;
    uVar122 = uVar121 >> 8;
    uVar125 = uVar124 >> 8;
    uVar128 = uVar127 >> 8;
    uVar131 = uVar130 >> 8;
    puVar23[-0x20] = (uVar91 != 0) * (uVar91 < 0x100) * (char)(uVar90 >> 8) - (0xff < uVar91);
    puVar23[-0x1f] = (uVar93 != 0) * (uVar93 < 0x100) * (char)(uVar92 >> 8) - (0xff < uVar93);
    puVar23[-0x1e] = (uVar95 != 0) * (uVar95 < 0x100) * (char)(uVar94 >> 8) - (0xff < uVar95);
    puVar23[-0x1d] = (uVar97 != 0) * (uVar97 < 0x100) * (char)(uVar96 >> 8) - (0xff < uVar97);
    puVar23[-0x1c] = (uVar99 != 0) * (uVar99 < 0x100) * (char)(uVar98 >> 8) - (0xff < uVar99);
    puVar23[-0x1b] = (uVar101 != 0) * (uVar101 < 0x100) * (char)(uVar100 >> 8) - (0xff < uVar101);
    puVar23[-0x1a] = (uVar103 != 0) * (uVar103 < 0x100) * (char)(uVar102 >> 8) - (0xff < uVar103);
    puVar23[-0x19] = (uVar105 != 0) * (uVar105 < 0x100) * (char)(uVar104 >> 8) - (0xff < uVar105);
    puVar23[-0x18] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar107 >> 8) - (0xff < uVar108);
    puVar23[-0x17] = (uVar113 != 0) * (uVar113 < 0x100) * (char)(uVar112 >> 8) - (0xff < uVar113);
    puVar23[-0x16] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar23[-0x15] = (uVar119 != 0) * (uVar119 < 0x100) * (char)(uVar118 >> 8) - (0xff < uVar119);
    puVar23[-0x14] = (uVar122 != 0) * (uVar122 < 0x100) * (char)(uVar121 >> 8) - (0xff < uVar122);
    puVar23[-0x13] = (uVar125 != 0) * (uVar125 < 0x100) * (char)(uVar124 >> 8) - (0xff < uVar125);
    puVar23[-0x12] = (uVar128 != 0) * (uVar128 < 0x100) * (char)(uVar127 >> 8) - (0xff < uVar128);
    puVar23[-0x11] = (uVar131 != 0) * (uVar131 < 0x100) * (char)(uVar130 >> 8) - (0xff < uVar131);
    uVar90 = sVar106 * 0x41 + sVar65;
    uVar92 = sVar111 * 0x3d + sVar66;
    uVar94 = sVar114 * 0x39 + sVar67;
    uVar96 = sVar117 * 0x36 + sVar68;
    uVar98 = sVar120 * 0x32 + sVar69;
    uVar100 = sVar123 * 0x2f + sVar70;
    uVar102 = sVar126 * 0x2c + sVar71;
    uVar104 = sVar129 * 0x29 + sVar72;
    uVar91 = uVar90 >> 8;
    uVar93 = uVar92 >> 8;
    uVar95 = uVar94 >> 8;
    uVar97 = uVar96 >> 8;
    uVar99 = uVar98 >> 8;
    uVar101 = uVar100 >> 8;
    uVar103 = uVar102 >> 8;
    uVar105 = uVar104 >> 8;
    uVar107 = sVar106 * 0x26 + sVar73;
    uVar112 = sVar111 * 0x23 + sVar74;
    uVar115 = sVar114 * 0x20 + sVar75;
    uVar118 = sVar117 * 0x1d + sVar76;
    uVar121 = sVar120 * 0x1b + sVar77;
    uVar124 = sVar123 * 0x19 + sVar78;
    uVar127 = sVar126 * 0x16 + sVar79;
    uVar130 = sVar129 * 0x14 + sVar80;
    uVar108 = uVar107 >> 8;
    uVar113 = uVar112 >> 8;
    uVar116 = uVar115 >> 8;
    uVar119 = uVar118 >> 8;
    uVar122 = uVar121 >> 8;
    uVar125 = uVar124 >> 8;
    uVar128 = uVar127 >> 8;
    uVar131 = uVar130 >> 8;
    puVar23[-0x10] = (uVar91 != 0) * (uVar91 < 0x100) * (char)(uVar90 >> 8) - (0xff < uVar91);
    puVar23[-0xf] = (uVar93 != 0) * (uVar93 < 0x100) * (char)(uVar92 >> 8) - (0xff < uVar93);
    puVar23[-0xe] = (uVar95 != 0) * (uVar95 < 0x100) * (char)(uVar94 >> 8) - (0xff < uVar95);
    puVar23[-0xd] = (uVar97 != 0) * (uVar97 < 0x100) * (char)(uVar96 >> 8) - (0xff < uVar97);
    puVar23[-0xc] = (uVar99 != 0) * (uVar99 < 0x100) * (char)(uVar98 >> 8) - (0xff < uVar99);
    puVar23[-0xb] = (uVar101 != 0) * (uVar101 < 0x100) * (char)(uVar100 >> 8) - (0xff < uVar101);
    puVar23[-10] = (uVar103 != 0) * (uVar103 < 0x100) * (char)(uVar102 >> 8) - (0xff < uVar103);
    puVar23[-9] = (uVar105 != 0) * (uVar105 < 0x100) * (char)(uVar104 >> 8) - (0xff < uVar105);
    puVar23[-8] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar107 >> 8) - (0xff < uVar108);
    puVar23[-7] = (uVar113 != 0) * (uVar113 < 0x100) * (char)(uVar112 >> 8) - (0xff < uVar113);
    puVar23[-6] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar23[-5] = (uVar119 != 0) * (uVar119 < 0x100) * (char)(uVar118 >> 8) - (0xff < uVar119);
    puVar23[-4] = (uVar122 != 0) * (uVar122 < 0x100) * (char)(uVar121 >> 8) - (0xff < uVar122);
    puVar23[-3] = (uVar125 != 0) * (uVar125 < 0x100) * (char)(uVar124 >> 8) - (0xff < uVar125);
    puVar23[-2] = (uVar128 != 0) * (uVar128 < 0x100) * (char)(uVar127 >> 8) - (0xff < uVar128);
    puVar23[-1] = (uVar131 != 0) * (uVar131 < 0x100) * (char)(uVar130 >> 8) - (0xff < uVar131);
    uVar107 = sVar106 * 0x12 + sVar81;
    uVar112 = sVar111 * 0x10 + sVar82;
    uVar115 = sVar114 * 0xf + sVar83;
    uVar118 = sVar117 * 0xd + sVar84;
    uVar121 = sVar120 * 0xc + sVar85;
    uVar124 = sVar123 * 10 + sVar86;
    uVar127 = sVar126 * 9 + sVar87;
    uVar130 = sVar129 * 8 + sVar88;
    uVar108 = uVar107 >> 8;
    uVar113 = uVar112 >> 8;
    uVar116 = uVar115 >> 8;
    uVar119 = uVar118 >> 8;
    uVar122 = uVar121 >> 8;
    uVar125 = uVar124 >> 8;
    uVar128 = uVar127 >> 8;
    uVar131 = uVar130 >> 8;
    uVar90 = sVar106 * 7 + sVar25;
    uVar92 = sVar111 * 6 + sVar27;
    uVar94 = sVar114 * 6 + sVar28;
    uVar96 = sVar117 * 5 + sVar29;
    uVar98 = sVar120 * 5 + sVar30;
    uVar100 = sVar123 * 4 + sVar31;
    uVar102 = sVar126 * 4 + sVar32;
    uVar104 = sVar129 * 4 + sVar33;
    uVar91 = uVar90 >> 8;
    uVar93 = uVar92 >> 8;
    uVar95 = uVar94 >> 8;
    uVar97 = uVar96 >> 8;
    uVar99 = uVar98 >> 8;
    uVar101 = uVar100 >> 8;
    uVar103 = uVar102 >> 8;
    uVar105 = uVar104 >> 8;
    *puVar23 = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar107 >> 8) - (0xff < uVar108);
    puVar23[1] = (uVar113 != 0) * (uVar113 < 0x100) * (char)(uVar112 >> 8) - (0xff < uVar113);
    puVar23[2] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar23[3] = (uVar119 != 0) * (uVar119 < 0x100) * (char)(uVar118 >> 8) - (0xff < uVar119);
    puVar23[4] = (uVar122 != 0) * (uVar122 < 0x100) * (char)(uVar121 >> 8) - (0xff < uVar122);
    puVar23[5] = (uVar125 != 0) * (uVar125 < 0x100) * (char)(uVar124 >> 8) - (0xff < uVar125);
    puVar23[6] = (uVar128 != 0) * (uVar128 < 0x100) * (char)(uVar127 >> 8) - (0xff < uVar128);
    puVar23[7] = (uVar131 != 0) * (uVar131 < 0x100) * (char)(uVar130 >> 8) - (0xff < uVar131);
    puVar23[8] = (uVar91 != 0) * (uVar91 < 0x100) * (char)(uVar90 >> 8) - (0xff < uVar91);
    puVar23[9] = (uVar93 != 0) * (uVar93 < 0x100) * (char)(uVar92 >> 8) - (0xff < uVar93);
    puVar23[10] = (uVar95 != 0) * (uVar95 < 0x100) * (char)(uVar94 >> 8) - (0xff < uVar95);
    puVar23[0xb] = (uVar97 != 0) * (uVar97 < 0x100) * (char)(uVar96 >> 8) - (0xff < uVar97);
    puVar23[0xc] = (uVar99 != 0) * (uVar99 < 0x100) * (char)(uVar98 >> 8) - (0xff < uVar99);
    puVar23[0xd] = (uVar101 != 0) * (uVar101 < 0x100) * (char)(uVar100 >> 8) - (0xff < uVar101);
    puVar23[0xe] = (uVar103 != 0) * (uVar103 < 0x100) * (char)(uVar102 >> 8) - (0xff < uVar103);
    puVar23[0xf] = (uVar105 != 0) * (uVar105 < 0x100) * (char)(uVar104 >> 8) - (0xff < uVar105);
    puVar23 = puVar23 + stride;
  }
  uVar1 = *(ulong *)(left_column + 8);
  auVar3._8_6_ = 0;
  auVar3._0_8_ = uVar1;
  auVar3[0xe] = (char)(uVar1 >> 0x38);
  auVar5._8_4_ = 0;
  auVar5._0_8_ = uVar1;
  auVar5[0xc] = (char)(uVar1 >> 0x30);
  auVar5._13_2_ = auVar3._13_2_;
  auVar7._8_4_ = 0;
  auVar7._0_8_ = uVar1;
  auVar7._12_3_ = auVar5._12_3_;
  auVar9._8_2_ = 0;
  auVar9._0_8_ = uVar1;
  auVar9[10] = (char)(uVar1 >> 0x28);
  auVar9._11_4_ = auVar7._11_4_;
  auVar11._8_2_ = 0;
  auVar11._0_8_ = uVar1;
  auVar11._10_5_ = auVar9._10_5_;
  auVar13[8] = (char)(uVar1 >> 0x20);
  auVar13._0_8_ = uVar1;
  auVar13._9_6_ = auVar11._9_6_;
  auVar17._7_8_ = 0;
  auVar17._0_7_ = auVar13._8_7_;
  auVar20._1_8_ = SUB158(auVar17 << 0x40,7);
  auVar20[0] = (char)(uVar1 >> 0x18);
  auVar20._9_6_ = 0;
  auVar21._1_10_ = SUB1510(auVar20 << 0x30,5);
  auVar21[0] = (char)(uVar1 >> 0x10);
  auVar21._11_4_ = 0;
  auVar15[2] = (char)(uVar1 >> 8);
  auVar15._0_2_ = (ushort)uVar1;
  auVar15._3_12_ = SUB1512(auVar21 << 0x20,3);
  auVar89._0_2_ = (ushort)uVar1 & 0xff;
  auVar89._2_13_ = auVar15._2_13_;
  auVar89[0xf] = 0;
  for (uVar22 = 0x1000100; uVar22 < 0xf0e0f0f; uVar22 = uVar22 + 0x2020202) {
    auVar110._4_4_ = uVar22;
    auVar110._0_4_ = uVar22;
    auVar110._8_4_ = uVar22;
    auVar110._12_4_ = uVar22;
    auVar26 = pshufb(auVar89,auVar110);
    sVar106 = auVar26._0_2_;
    sVar111 = auVar26._2_2_;
    sVar114 = auVar26._4_2_;
    sVar117 = auVar26._6_2_;
    sVar120 = auVar26._8_2_;
    sVar123 = auVar26._10_2_;
    sVar126 = auVar26._12_2_;
    sVar129 = auVar26._14_2_;
    uVar90 = sVar106 * 0xff + sVar24 + 0x80;
    uVar92 = sVar111 * 0xf8 + sVar34;
    uVar94 = sVar114 * 0xf0 + sVar35;
    uVar96 = sVar117 * 0xe9 + sVar36;
    uVar98 = sVar120 * 0xe1 + sVar37;
    uVar100 = sVar123 * 0xda + sVar38;
    uVar102 = sVar126 * 0xd2 + sVar39;
    uVar104 = sVar129 * 0xcb + sVar40;
    uVar91 = uVar90 >> 8;
    uVar93 = uVar92 >> 8;
    uVar95 = uVar94 >> 8;
    uVar97 = uVar96 >> 8;
    uVar99 = uVar98 >> 8;
    uVar101 = uVar100 >> 8;
    uVar103 = uVar102 >> 8;
    uVar105 = uVar104 >> 8;
    uVar107 = sVar106 * 0xc4 + sVar41;
    uVar112 = sVar111 * 0xbd + sVar42;
    uVar115 = sVar114 * 0xb6 + sVar43;
    uVar118 = sVar117 * 0xb0 + sVar44;
    uVar121 = sVar120 * 0xa9 + sVar45;
    uVar124 = sVar123 * 0xa3 + sVar46;
    uVar127 = sVar126 * 0x9c + sVar47;
    uVar130 = sVar129 * 0x96 + sVar48;
    uVar108 = uVar107 >> 8;
    uVar113 = uVar112 >> 8;
    uVar116 = uVar115 >> 8;
    uVar119 = uVar118 >> 8;
    uVar122 = uVar121 >> 8;
    uVar125 = uVar124 >> 8;
    uVar128 = uVar127 >> 8;
    uVar131 = uVar130 >> 8;
    puVar23[-0x30] = (uVar91 != 0) * (uVar91 < 0x100) * (char)(uVar90 >> 8) - (0xff < uVar91);
    puVar23[-0x2f] = (uVar93 != 0) * (uVar93 < 0x100) * (char)(uVar92 >> 8) - (0xff < uVar93);
    puVar23[-0x2e] = (uVar95 != 0) * (uVar95 < 0x100) * (char)(uVar94 >> 8) - (0xff < uVar95);
    puVar23[-0x2d] = (uVar97 != 0) * (uVar97 < 0x100) * (char)(uVar96 >> 8) - (0xff < uVar97);
    puVar23[-0x2c] = (uVar99 != 0) * (uVar99 < 0x100) * (char)(uVar98 >> 8) - (0xff < uVar99);
    puVar23[-0x2b] = (uVar101 != 0) * (uVar101 < 0x100) * (char)(uVar100 >> 8) - (0xff < uVar101);
    puVar23[-0x2a] = (uVar103 != 0) * (uVar103 < 0x100) * (char)(uVar102 >> 8) - (0xff < uVar103);
    puVar23[-0x29] = (uVar105 != 0) * (uVar105 < 0x100) * (char)(uVar104 >> 8) - (0xff < uVar105);
    puVar23[-0x28] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar107 >> 8) - (0xff < uVar108);
    puVar23[-0x27] = (uVar113 != 0) * (uVar113 < 0x100) * (char)(uVar112 >> 8) - (0xff < uVar113);
    puVar23[-0x26] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar23[-0x25] = (uVar119 != 0) * (uVar119 < 0x100) * (char)(uVar118 >> 8) - (0xff < uVar119);
    puVar23[-0x24] = (uVar122 != 0) * (uVar122 < 0x100) * (char)(uVar121 >> 8) - (0xff < uVar122);
    puVar23[-0x23] = (uVar125 != 0) * (uVar125 < 0x100) * (char)(uVar124 >> 8) - (0xff < uVar125);
    puVar23[-0x22] = (uVar128 != 0) * (uVar128 < 0x100) * (char)(uVar127 >> 8) - (0xff < uVar128);
    puVar23[-0x21] = (uVar131 != 0) * (uVar131 < 0x100) * (char)(uVar130 >> 8) - (0xff < uVar131);
    uVar90 = sVar106 * 0x90 + sVar49;
    uVar92 = sVar111 * 0x8a + sVar50;
    uVar94 = sVar114 * 0x85 + sVar51;
    uVar96 = sVar117 * 0x7f + sVar52;
    uVar98 = sVar120 * 0x79 + sVar53;
    uVar100 = sVar123 * 0x74 + sVar54;
    uVar102 = sVar126 * 0x6f + sVar55;
    uVar104 = sVar129 * 0x6a + sVar56;
    uVar91 = uVar90 >> 8;
    uVar93 = uVar92 >> 8;
    uVar95 = uVar94 >> 8;
    uVar97 = uVar96 >> 8;
    uVar99 = uVar98 >> 8;
    uVar101 = uVar100 >> 8;
    uVar103 = uVar102 >> 8;
    uVar105 = uVar104 >> 8;
    uVar107 = sVar106 * 0x65 + sVar57;
    uVar112 = sVar111 * 0x60 + sVar58;
    uVar115 = sVar114 * 0x5b + sVar59;
    uVar118 = sVar117 * 0x56 + sVar60;
    uVar121 = sVar120 * 0x52 + sVar61;
    uVar124 = sVar123 * 0x4d + sVar62;
    uVar127 = sVar126 * 0x49 + sVar63;
    uVar130 = sVar129 * 0x45 + sVar64;
    uVar108 = uVar107 >> 8;
    uVar113 = uVar112 >> 8;
    uVar116 = uVar115 >> 8;
    uVar119 = uVar118 >> 8;
    uVar122 = uVar121 >> 8;
    uVar125 = uVar124 >> 8;
    uVar128 = uVar127 >> 8;
    uVar131 = uVar130 >> 8;
    puVar23[-0x20] = (uVar91 != 0) * (uVar91 < 0x100) * (char)(uVar90 >> 8) - (0xff < uVar91);
    puVar23[-0x1f] = (uVar93 != 0) * (uVar93 < 0x100) * (char)(uVar92 >> 8) - (0xff < uVar93);
    puVar23[-0x1e] = (uVar95 != 0) * (uVar95 < 0x100) * (char)(uVar94 >> 8) - (0xff < uVar95);
    puVar23[-0x1d] = (uVar97 != 0) * (uVar97 < 0x100) * (char)(uVar96 >> 8) - (0xff < uVar97);
    puVar23[-0x1c] = (uVar99 != 0) * (uVar99 < 0x100) * (char)(uVar98 >> 8) - (0xff < uVar99);
    puVar23[-0x1b] = (uVar101 != 0) * (uVar101 < 0x100) * (char)(uVar100 >> 8) - (0xff < uVar101);
    puVar23[-0x1a] = (uVar103 != 0) * (uVar103 < 0x100) * (char)(uVar102 >> 8) - (0xff < uVar103);
    puVar23[-0x19] = (uVar105 != 0) * (uVar105 < 0x100) * (char)(uVar104 >> 8) - (0xff < uVar105);
    puVar23[-0x18] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar107 >> 8) - (0xff < uVar108);
    puVar23[-0x17] = (uVar113 != 0) * (uVar113 < 0x100) * (char)(uVar112 >> 8) - (0xff < uVar113);
    puVar23[-0x16] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar23[-0x15] = (uVar119 != 0) * (uVar119 < 0x100) * (char)(uVar118 >> 8) - (0xff < uVar119);
    puVar23[-0x14] = (uVar122 != 0) * (uVar122 < 0x100) * (char)(uVar121 >> 8) - (0xff < uVar122);
    puVar23[-0x13] = (uVar125 != 0) * (uVar125 < 0x100) * (char)(uVar124 >> 8) - (0xff < uVar125);
    puVar23[-0x12] = (uVar128 != 0) * (uVar128 < 0x100) * (char)(uVar127 >> 8) - (0xff < uVar128);
    puVar23[-0x11] = (uVar131 != 0) * (uVar131 < 0x100) * (char)(uVar130 >> 8) - (0xff < uVar131);
    uVar90 = sVar106 * 0x41 + sVar65;
    uVar92 = sVar111 * 0x3d + sVar66;
    uVar94 = sVar114 * 0x39 + sVar67;
    uVar96 = sVar117 * 0x36 + sVar68;
    uVar98 = sVar120 * 0x32 + sVar69;
    uVar100 = sVar123 * 0x2f + sVar70;
    uVar102 = sVar126 * 0x2c + sVar71;
    uVar104 = sVar129 * 0x29 + sVar72;
    uVar91 = uVar90 >> 8;
    uVar93 = uVar92 >> 8;
    uVar95 = uVar94 >> 8;
    uVar97 = uVar96 >> 8;
    uVar99 = uVar98 >> 8;
    uVar101 = uVar100 >> 8;
    uVar103 = uVar102 >> 8;
    uVar105 = uVar104 >> 8;
    uVar107 = sVar106 * 0x26 + sVar73;
    uVar112 = sVar111 * 0x23 + sVar74;
    uVar115 = sVar114 * 0x20 + sVar75;
    uVar118 = sVar117 * 0x1d + sVar76;
    uVar121 = sVar120 * 0x1b + sVar77;
    uVar124 = sVar123 * 0x19 + sVar78;
    uVar127 = sVar126 * 0x16 + sVar79;
    uVar130 = sVar129 * 0x14 + sVar80;
    uVar108 = uVar107 >> 8;
    uVar113 = uVar112 >> 8;
    uVar116 = uVar115 >> 8;
    uVar119 = uVar118 >> 8;
    uVar122 = uVar121 >> 8;
    uVar125 = uVar124 >> 8;
    uVar128 = uVar127 >> 8;
    uVar131 = uVar130 >> 8;
    puVar23[-0x10] = (uVar91 != 0) * (uVar91 < 0x100) * (char)(uVar90 >> 8) - (0xff < uVar91);
    puVar23[-0xf] = (uVar93 != 0) * (uVar93 < 0x100) * (char)(uVar92 >> 8) - (0xff < uVar93);
    puVar23[-0xe] = (uVar95 != 0) * (uVar95 < 0x100) * (char)(uVar94 >> 8) - (0xff < uVar95);
    puVar23[-0xd] = (uVar97 != 0) * (uVar97 < 0x100) * (char)(uVar96 >> 8) - (0xff < uVar97);
    puVar23[-0xc] = (uVar99 != 0) * (uVar99 < 0x100) * (char)(uVar98 >> 8) - (0xff < uVar99);
    puVar23[-0xb] = (uVar101 != 0) * (uVar101 < 0x100) * (char)(uVar100 >> 8) - (0xff < uVar101);
    puVar23[-10] = (uVar103 != 0) * (uVar103 < 0x100) * (char)(uVar102 >> 8) - (0xff < uVar103);
    puVar23[-9] = (uVar105 != 0) * (uVar105 < 0x100) * (char)(uVar104 >> 8) - (0xff < uVar105);
    puVar23[-8] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar107 >> 8) - (0xff < uVar108);
    puVar23[-7] = (uVar113 != 0) * (uVar113 < 0x100) * (char)(uVar112 >> 8) - (0xff < uVar113);
    puVar23[-6] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar23[-5] = (uVar119 != 0) * (uVar119 < 0x100) * (char)(uVar118 >> 8) - (0xff < uVar119);
    puVar23[-4] = (uVar122 != 0) * (uVar122 < 0x100) * (char)(uVar121 >> 8) - (0xff < uVar122);
    puVar23[-3] = (uVar125 != 0) * (uVar125 < 0x100) * (char)(uVar124 >> 8) - (0xff < uVar125);
    puVar23[-2] = (uVar128 != 0) * (uVar128 < 0x100) * (char)(uVar127 >> 8) - (0xff < uVar128);
    puVar23[-1] = (uVar131 != 0) * (uVar131 < 0x100) * (char)(uVar130 >> 8) - (0xff < uVar131);
    uVar107 = sVar106 * 0x12 + sVar81;
    uVar112 = sVar111 * 0x10 + sVar82;
    uVar115 = sVar114 * 0xf + sVar83;
    uVar118 = sVar117 * 0xd + sVar84;
    uVar121 = sVar120 * 0xc + sVar85;
    uVar124 = sVar123 * 10 + sVar86;
    uVar127 = sVar126 * 9 + sVar87;
    uVar130 = sVar129 * 8 + sVar88;
    uVar108 = uVar107 >> 8;
    uVar113 = uVar112 >> 8;
    uVar116 = uVar115 >> 8;
    uVar119 = uVar118 >> 8;
    uVar122 = uVar121 >> 8;
    uVar125 = uVar124 >> 8;
    uVar128 = uVar127 >> 8;
    uVar131 = uVar130 >> 8;
    uVar90 = sVar106 * 7 + sVar25;
    uVar92 = sVar111 * 6 + sVar27;
    uVar94 = sVar114 * 6 + sVar28;
    uVar96 = sVar117 * 5 + sVar29;
    uVar98 = sVar120 * 5 + sVar30;
    uVar100 = sVar123 * 4 + sVar31;
    uVar102 = sVar126 * 4 + sVar32;
    uVar104 = sVar129 * 4 + sVar33;
    uVar91 = uVar90 >> 8;
    uVar93 = uVar92 >> 8;
    uVar95 = uVar94 >> 8;
    uVar97 = uVar96 >> 8;
    uVar99 = uVar98 >> 8;
    uVar101 = uVar100 >> 8;
    uVar103 = uVar102 >> 8;
    uVar105 = uVar104 >> 8;
    *puVar23 = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar107 >> 8) - (0xff < uVar108);
    puVar23[1] = (uVar113 != 0) * (uVar113 < 0x100) * (char)(uVar112 >> 8) - (0xff < uVar113);
    puVar23[2] = (uVar116 != 0) * (uVar116 < 0x100) * (char)(uVar115 >> 8) - (0xff < uVar116);
    puVar23[3] = (uVar119 != 0) * (uVar119 < 0x100) * (char)(uVar118 >> 8) - (0xff < uVar119);
    puVar23[4] = (uVar122 != 0) * (uVar122 < 0x100) * (char)(uVar121 >> 8) - (0xff < uVar122);
    puVar23[5] = (uVar125 != 0) * (uVar125 < 0x100) * (char)(uVar124 >> 8) - (0xff < uVar125);
    puVar23[6] = (uVar128 != 0) * (uVar128 < 0x100) * (char)(uVar127 >> 8) - (0xff < uVar128);
    puVar23[7] = (uVar131 != 0) * (uVar131 < 0x100) * (char)(uVar130 >> 8) - (0xff < uVar131);
    puVar23[8] = (uVar91 != 0) * (uVar91 < 0x100) * (char)(uVar90 >> 8) - (0xff < uVar91);
    puVar23[9] = (uVar93 != 0) * (uVar93 < 0x100) * (char)(uVar92 >> 8) - (0xff < uVar93);
    puVar23[10] = (uVar95 != 0) * (uVar95 < 0x100) * (char)(uVar94 >> 8) - (0xff < uVar95);
    puVar23[0xb] = (uVar97 != 0) * (uVar97 < 0x100) * (char)(uVar96 >> 8) - (0xff < uVar97);
    puVar23[0xc] = (uVar99 != 0) * (uVar99 < 0x100) * (char)(uVar98 >> 8) - (0xff < uVar99);
    puVar23[0xd] = (uVar101 != 0) * (uVar101 < 0x100) * (char)(uVar100 >> 8) - (0xff < uVar101);
    puVar23[0xe] = (uVar103 != 0) * (uVar103 < 0x100) * (char)(uVar102 >> 8) - (0xff < uVar103);
    puVar23[0xf] = (uVar105 != 0) * (uVar105 < 0x100) * (char)(uVar104 >> 8) - (0xff < uVar105);
    puVar23 = puVar23 + stride;
  }
  return;
}

Assistant:

void aom_smooth_h_predictor_64x16_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i top_right = _mm_set1_epi16(top_row[63]);
  const __m128i left1 = cvtepu8_epi16(LoadLo8(left_column));
  const __m128i weights_lolo = LoadUnaligned16(smooth_weights + 60);
  const __m128i weights_lohi = LoadUnaligned16(smooth_weights + 76);
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i weights1 = cvtepu8_epi16(weights_lolo);
  const __m128i weights2 = cvtepu8_epi16(_mm_srli_si128(weights_lolo, 8));
  const __m128i weights3 = cvtepu8_epi16(weights_lohi);
  const __m128i weights4 = cvtepu8_epi16(_mm_srli_si128(weights_lohi, 8));
  const __m128i inverted_weights1 = _mm_sub_epi16(scale, weights1);
  const __m128i inverted_weights2 = _mm_sub_epi16(scale, weights2);
  const __m128i inverted_weights3 = _mm_sub_epi16(scale, weights3);
  const __m128i inverted_weights4 = _mm_sub_epi16(scale, weights4);
  const __m128i scaled_top_right1 =
      _mm_mullo_epi16(inverted_weights1, top_right);
  const __m128i scaled_top_right2 =
      _mm_mullo_epi16(inverted_weights2, top_right);
  const __m128i scaled_top_right3 =
      _mm_mullo_epi16(inverted_weights3, top_right);
  const __m128i scaled_top_right4 =
      _mm_mullo_epi16(inverted_weights4, top_right);
  const __m128i weights_hilo = LoadUnaligned16(smooth_weights + 92);
  const __m128i weights_hihi = LoadUnaligned16(smooth_weights + 108);
  const __m128i weights5 = cvtepu8_epi16(weights_hilo);
  const __m128i weights6 = cvtepu8_epi16(_mm_srli_si128(weights_hilo, 8));
  const __m128i weights7 = cvtepu8_epi16(weights_hihi);
  const __m128i weights8 = cvtepu8_epi16(_mm_srli_si128(weights_hihi, 8));
  const __m128i inverted_weights5 = _mm_sub_epi16(scale, weights5);
  const __m128i inverted_weights6 = _mm_sub_epi16(scale, weights6);
  const __m128i inverted_weights7 = _mm_sub_epi16(scale, weights7);
  const __m128i inverted_weights8 = _mm_sub_epi16(scale, weights8);
  const __m128i scaled_top_right5 =
      _mm_mullo_epi16(inverted_weights5, top_right);
  const __m128i scaled_top_right6 =
      _mm_mullo_epi16(inverted_weights6, top_right);
  const __m128i scaled_top_right7 =
      _mm_mullo_epi16(inverted_weights7, top_right);
  const __m128i scaled_top_right8 =
      _mm_mullo_epi16(inverted_weights8, top_right);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    __m128i y_select = _mm_set1_epi32(y_mask);
    __m128i left_y = _mm_shuffle_epi8(left1, y_select);
    write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                   scaled_top_right1, scaled_top_right2, round);
    write_smooth_directional_sum16(dst + 16, left_y, left_y, weights3, weights4,
                                   scaled_top_right3, scaled_top_right4, round);
    write_smooth_directional_sum16(dst + 32, left_y, left_y, weights5, weights6,
                                   scaled_top_right5, scaled_top_right6, round);
    write_smooth_directional_sum16(dst + 48, left_y, left_y, weights7, weights8,
                                   scaled_top_right7, scaled_top_right8, round);
    dst += stride;
  }
  const __m128i left2 = cvtepu8_epi16(LoadLo8(left_column + 8));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    __m128i y_select = _mm_set1_epi32(y_mask);
    __m128i left_y = _mm_shuffle_epi8(left2, y_select);
    write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                   scaled_top_right1, scaled_top_right2, round);
    write_smooth_directional_sum16(dst + 16, left_y, left_y, weights3, weights4,
                                   scaled_top_right3, scaled_top_right4, round);
    write_smooth_directional_sum16(dst + 32, left_y, left_y, weights5, weights6,
                                   scaled_top_right5, scaled_top_right6, round);
    write_smooth_directional_sum16(dst + 48, left_y, left_y, weights7, weights8,
                                   scaled_top_right7, scaled_top_right8, round);
    dst += stride;
  }
}